

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hwlocxx.hpp
# Opt level: O0

void __thiscall hwlocxx::topology::topology(topology *this)

{
  element_type *peVar1;
  shared_ptr<hwloc_topology> local_38 [2];
  undefined8 local_18;
  hwloc_topology_t system;
  topology *this_local;
  
  system = (hwloc_topology_t)this;
  std::shared_ptr<hwloc_topology>::shared_ptr(&this->topology_,(nullptr_t)0x0);
  local_18 = 0;
  hwloc_topology_init(&local_18);
  std::shared_ptr<hwloc_topology>::
  shared_ptr<hwloc_topology,hwlocxx::topology::topology()::_lambda(hwloc_topology*)_1_,void>
            (local_38,local_18);
  std::shared_ptr<hwloc_topology>::operator=(&this->topology_,local_38);
  std::shared_ptr<hwloc_topology>::~shared_ptr(local_38);
  peVar1 = std::__shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2> *)this);
  hwloc_topology_load(peVar1);
  return;
}

Assistant:

topology() : topology_{nullptr}
   {
      hwloc_topology_t system = nullptr;
      hwloc_topology_init(&system);
      topology_ = std::shared_ptr<hwloc_topology>{
          system, [=](hwloc_topology_t ptr) { hwloc_topology_destroy(ptr); }};
      hwloc_topology_load(topology_.get());
   }